

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O1

int os_tmpname(lua_State *L)

{
  int iVar1;
  char buff [32];
  char local_28 [32];
  
  builtin_strncpy(local_28,"/tmp/lua_XXXXXX",0x10);
  iVar1 = mkstemp64(local_28);
  if (iVar1 == -1) {
    iVar1 = luaL_error(L,"unable to generate a unique filename");
  }
  else {
    close(iVar1);
    lua_pushstring(L,local_28);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int os_tmpname (lua_State *L) {
  char buff[LUA_TMPNAMBUFSIZE];
  int err;
  lua_tmpnam(buff, err);
  if (l_unlikely(err))
    return luaL_error(L, "unable to generate a unique filename");
  lua_pushstring(L, buff);
  return 1;
}